

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O3

int SHA512Reset(SHA512Context *context)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  
  if (context != (SHA512Context *)0x0) {
    context->Length_Low = 0;
    context->Length_High = 0;
    context->Message_Block_Index = 0;
    lVar3 = 0;
    do {
      uVar2 = *(undefined8 *)((long)SHA512_H0 + lVar3 + 8);
      puVar1 = (undefined8 *)((long)context->Intermediate_Hash + lVar3);
      *puVar1 = *(undefined8 *)((long)SHA512_H0 + lVar3);
      puVar1[1] = uVar2;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x40);
    context->Computed = 0;
    context->Corrupted = 0;
    return 0;
  }
  return 1;
}

Assistant:

static int SHA384_512Reset(SHA512Context *context, uint64_t H0[])
#endif /* USE_32BIT_ONLY */
{
    int i;
    if (!context)
        return shaNull;

    context->Message_Block_Index = 0;

#ifdef USE_32BIT_ONLY
    context->Length[0] = context->Length[1] = 0;
    context->Length[2] = context->Length[3] = 0;

    for (i = 0; i < SHA512HashSize / 4; i++)
        context->Intermediate_Hash[i] = H0[i];
#else /* !USE_32BIT_ONLY */
    context->Length_High = context->Length_Low = 0;

    for (i = 0; i < SHA512HashSize / 8; i++)
        context->Intermediate_Hash[i] = H0[i];
#endif /* USE_32BIT_ONLY */

    context->Computed = 0;
    context->Corrupted = 0;

    return shaSuccess;
}